

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.h
# Opt level: O2

void __thiscall
capnp::Orphan<capnp::DynamicValue>::Orphan<capnp::Text>
          (Orphan<capnp::DynamicValue> *this,Orphan<capnp::Text> *other)

{
  Builder local_78;
  Builder local_60;
  
  _::OrphanBuilder::asText(&local_78,&other->builder);
  local_60.field_1.textValue.content.size_ = local_78.content.size_;
  local_60.field_1.intValue = local_78._0_8_;
  local_60.field_1.textValue.content.ptr = local_78.content.ptr;
  local_60.type = TEXT;
  Orphan(this,&local_60,&other->builder);
  DynamicValue::Builder::~Builder(&local_60);
  return;
}

Assistant:

inline Orphan<DynamicValue>::Orphan(Orphan<T>&& other)
    : Orphan(other.get(), kj::mv(other.builder)) {}